

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O0

GetSupportedFunctionResponseStruct *
cfd::js::api::ExecuteResponseStructApi<cfd::js::api::GetSupportedFunctionResponseStruct>
          (GetSupportedFunctionResponseStruct *__return_storage_ptr__,
          function<cfd::js::api::GetSupportedFunctionResponseStruct_()> *call_function,
          string *fuction_name)

{
  CfdException *cfde;
  exception *except;
  GetSupportedFunctionResponseStruct local_e8;
  undefined1 local_21;
  string *local_20;
  string *fuction_name_local;
  function<cfd::js::api::GetSupportedFunctionResponseStruct_()> *call_function_local;
  GetSupportedFunctionResponseStruct *response;
  
  local_21 = 0;
  local_20 = fuction_name;
  fuction_name_local = (string *)call_function;
  call_function_local =
       (function<cfd::js::api::GetSupportedFunctionResponseStruct_()> *)__return_storage_ptr__;
  GetSupportedFunctionResponseStruct::GetSupportedFunctionResponseStruct(__return_storage_ptr__);
  cfd::Initialize();
  std::function<cfd::js::api::GetSupportedFunctionResponseStruct_()>::operator()
            (&local_e8,call_function);
  GetSupportedFunctionResponseStruct::operator=(__return_storage_ptr__,&local_e8);
  GetSupportedFunctionResponseStruct::~GetSupportedFunctionResponseStruct(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteResponseStructApi(
    std::function<ResponseStructType()> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function();
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}